

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::PortPackedVisitor::add_struct
               (PackedStructGraph *g,PackedStruct *s,PackedStruct *parent)

{
  bool bVar1;
  _Base_ptr *this;
  reference pPVar2;
  PackedStructFieldDef *attr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_> *__range2;
  PackedStructNode *local_30;
  PackedStructNode *n;
  PackedStructNode *parent_node;
  PackedStruct *parent_local;
  PackedStruct *s_local;
  PackedStructGraph *g_local;
  
  parent_node = (PackedStructNode *)parent;
  parent_local = s;
  s_local = (PackedStruct *)g;
  n = PackedStructGraph::get_node(g,parent);
  local_30 = PackedStructGraph::get_node((PackedStructGraph *)s_local,parent_local);
  if (local_30 != (PackedStructNode *)0x0) {
    local_30->parent = n;
    std::
    set<kratos::PackedStructNode*,std::less<kratos::PackedStructNode*>,std::allocator<kratos::PackedStructNode*>>
    ::emplace<kratos::PackedStructNode*&>
              ((set<kratos::PackedStructNode*,std::less<kratos::PackedStructNode*>,std::allocator<kratos::PackedStructNode*>>
                *)&n->children,&local_30);
  }
  this = &(parent_node->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __end2 = std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ::begin((vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                    *)this);
  attr = (PackedStructFieldDef *)
         std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
         end((vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_> *)
             this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
                                *)&attr);
    if (!bVar1) break;
    pPVar2 = __gnu_cxx::
             __normal_iterator<const_kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
             ::operator*(&__end2);
    if (pPVar2->struct_ != (PackedStruct *)0x0) {
      add_struct((PackedStructGraph *)s_local,(PackedStruct *)parent_node,pPVar2->struct_);
    }
    __gnu_cxx::
    __normal_iterator<const_kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

static void add_struct(PackedStructGraph* g, const PackedStruct* s,
                           const PackedStruct* parent) {
        auto* parent_node = g->get_node(parent);
        auto* n = g->get_node(s);
        if (n) {
            n->parent = parent_node;
            parent_node->children.emplace(n);
        }

        // look for child definition
        for (auto const& attr : parent->attributes) {
            if (attr.struct_) {
                add_struct(g, parent, attr.struct_);
            }
        }
    }